

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

uint32 __thiscall Js::JavascriptArray::GetNextIndexHelper<void*>(JavascriptArray *this,uint32 index)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  char *in_RCX;
  uint32 index_00;
  uint uVar8;
  ulong uVar10;
  ulong uVar9;
  
  if ((this->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    in_RCX = "array head should never be null";
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xae8,"(this->head)","array head should never be null");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (index == 0xffffffff) {
    index_00 = ((this->head).ptr)->left;
  }
  else {
    index_00 = index + 1;
  }
  pSVar7 = GetBeginLookupSegment(this,index_00,true);
  do {
    if (pSVar7 == (SparseArraySegmentBase *)0x0) {
      return 0xffffffff;
    }
    uVar1 = pSVar7->left;
    uVar8 = index_00 - uVar1;
    uVar9 = (ulong)uVar8;
    if ((uVar1 <= index_00) && (uVar2 = pSVar7->length, uVar8 < uVar2)) {
      bVar5 = true;
      if (*(undefined1 **)(&pSVar7[1].left + (ulong)uVar8 * 2) == &DAT_40002fff80002) {
        uVar10 = (ulong)uVar8;
        do {
          if (uVar2 - 1 == (int)uVar10) {
            bVar5 = false;
            goto LAB_00b975e7;
          }
          uVar9 = uVar10 + 1;
          lVar4 = uVar10 * 2;
          uVar10 = uVar9;
        } while (*(undefined1 **)(&pSVar7[1].size + lVar4) == &DAT_40002fff80002);
        bVar5 = (uint)uVar9 < uVar2;
      }
      in_RCX = (char *)(ulong)((int)uVar9 + uVar1);
LAB_00b975e7:
      if (bVar5) {
        return (uint32)in_RCX;
      }
    }
    pSVar7 = (pSVar7->next).ptr;
    if ((pSVar7 != (SparseArraySegmentBase *)0x0) && (index_00 <= pSVar7->left)) {
      index_00 = pSVar7->left;
    }
  } while( true );
}

Assistant:

uint32 JavascriptArray::GetNextIndexHelper(uint32 index) const
    {
        AssertMsg(this->head, "array head should never be null");
        uint candidateIndex;

        if (index == JavascriptArray::InvalidIndex)
        {
            candidateIndex = head->left;
        }
        else
        {
            candidateIndex = index + 1;
        }

        SparseArraySegment<T>* current = (SparseArraySegment<T>*)this->GetBeginLookupSegment(candidateIndex);

        while (current != nullptr)
        {
            if ((current->left <= candidateIndex) && ((candidateIndex - current->left) < current->length))
            {
                for (uint i = candidateIndex - current->left; i < current->length; i++)
                {
                    if (!SparseArraySegment<T>::IsMissingItem(&current->elements[i]))
                    {
                        return i + current->left;
                    }
                }
            }
            current = SparseArraySegment<T>::From(current->next);
            if (current != NULL)
            {
                if (candidateIndex < current->left)
                {
                    candidateIndex = current->left;
                }
            }
        }
        return JavascriptArray::InvalidIndex;
    }